

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_locate_subset(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  uint uVar1;
  REF_STATUS RVar2;
  ulong unaff_R13;
  int iVar3;
  bool bVar4;
  REF_BOOL increase_fuzz;
  REF_BOOL local_34;
  
  ref_mpi = ref_interp->ref_mpi;
  if (ref_interp->instrument != 0) {
    uVar1 = ref_mpi_stopwatch_start(ref_mpi);
    unaff_R13 = (ulong)uVar1;
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x702,"ref_interp_locate_subset",unaff_R13,"locate clock");
      return uVar1;
    }
  }
  uVar1 = ref_interp_seed_tree(ref_interp);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x704,
           "ref_interp_locate_subset",(ulong)uVar1,"seed tree nodes");
    unaff_R13 = (ulong)uVar1;
  }
  RVar2 = (REF_STATUS)unaff_R13;
  if (uVar1 == 0) {
    if (ref_interp->instrument != 0) {
      uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"seed tree");
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x706,"ref_interp_locate_subset",(ulong)uVar1,"locate clock");
        unaff_R13 = (ulong)uVar1;
      }
      if (uVar1 != 0) {
        return (REF_STATUS)unaff_R13;
      }
    }
    uVar1 = ref_interp_process_agents(ref_interp);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x708,"ref_interp_locate_subset",(ulong)uVar1,"drain");
      unaff_R13 = (ulong)uVar1;
    }
    RVar2 = (REF_STATUS)unaff_R13;
    if (uVar1 == 0) {
      if (ref_interp->instrument != 0) {
        uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"drain");
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x70a,"ref_interp_locate_subset",(ulong)uVar1,"locate clock");
          unaff_R13 = (ulong)uVar1;
        }
        if (uVar1 != 0) {
          return (REF_STATUS)unaff_R13;
        }
      }
      local_34 = 0;
      iVar3 = 0xb;
      do {
        if ((local_34 != 0) &&
           (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi->id == 0)) {
          printf("retry tree search with %e fuzz\n");
        }
        uVar1 = ref_interp_tree(ref_interp,&local_34);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x714,"ref_interp_locate_subset",(ulong)uVar1,"tree");
          unaff_R13 = (ulong)uVar1;
        }
        if (uVar1 != 0) {
          return (REF_STATUS)unaff_R13;
        }
        if (ref_interp->instrument != 0) {
          uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"tree");
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x716,"ref_interp_locate_subset",(ulong)uVar1,"locate clock");
            unaff_R13 = (ulong)uVar1;
          }
          if (uVar1 != 0) {
            return (REF_STATUS)unaff_R13;
          }
        }
        bVar4 = iVar3 != 0;
        iVar3 = iVar3 + -1;
      } while ((local_34 != 0) && (bVar4));
      if ((long)local_34 == 0) {
        RVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x719,"ref_interp_locate_subset","unable to grow fuzz to find tree candidate",0,
               (long)local_34);
        RVar2 = 1;
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_subset(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_seed_tree(ref_interp), "seed tree nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "seed tree"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}